

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

Pipeline * __thiscall
n_e_s::core::Mos6502::create_nmi(Pipeline *__return_storage_ptr__,Mos6502 *this)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)this->registers_->pc);
  Pipeline::Pipeline(__return_storage_ptr__);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:667:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:667:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:671:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:671:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:674:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:674:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:677:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:677:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:678:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:678:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:679:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/src/mos6502.cpp:679:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Pipeline::push(__return_storage_ptr__,(StepT *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_nmi() {
    // Dummy read
    mmu_->read_byte(registers_->pc);
    Pipeline result;

    result.push([this] {
        // Dummy read
        mmu_->read_byte(registers_->pc);
    });
    result.push([this] {
        stack_.push_byte(static_cast<uint8_t>(registers_->pc >> 8u));
    });
    result.push([this] {
        stack_.push_byte(static_cast<uint8_t>(registers_->pc & 0xFFu));
    });
    result.push([this] { stack_.push_byte(registers_->p); });
    result.push([this] { tmp_ = mmu_->read_byte(0xFFFA); });
    result.push([this] {
        const uint16_t pch = mmu_->read_byte(0xFFFB) << 8u;
        registers_->pc = pch | tmp_;
    });

    return result;
}